

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyArgumentSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::EmptyArgumentSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  EmptyArgumentSyntax *pEVar6;
  
  pEVar6 = (EmptyArgumentSyntax *)allocate(this,0x20,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pEVar6->super_ArgumentSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar6->super_ArgumentSyntax).super_SyntaxNode.kind = EmptyArgument;
  (pEVar6->placeholder).kind = TVar2;
  (pEVar6->placeholder).field_0x2 = uVar3;
  (pEVar6->placeholder).numFlags = (NumericTokenFlags)NVar4.raw;
  (pEVar6->placeholder).rawLen = uVar5;
  (pEVar6->placeholder).info = pIVar1;
  return pEVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }